

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

void __thiscall spirv_cross::SPIRConstant::SPIRConstant(SPIRConstant *this,uint32_t constant_type_)

{
  (this->super_IVariant).self.id = 0;
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRConstant_0047f8b0;
  *(uint32_t *)&(this->super_IVariant).field_0xc = constant_type_;
  ConstantMatrix::ConstantMatrix(&this->m);
  (this->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.buffer_size =
       0;
  this->specialization = false;
  this->is_used_as_array_length = false;
  this->is_used_as_lut = false;
  this->is_null_array_specialized_length = false;
  (this->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr =
       (TypedID<(spirv_cross::Types)3> *)&(this->subconstants).stack_storage;
  (this->subconstants).buffer_capacity = 8;
  (this->specialization_constant_macro_name)._M_dataplus._M_p =
       (pointer)&(this->specialization_constant_macro_name).field_2;
  (this->specialization_constant_macro_name)._M_string_length = 0;
  (this->specialization_constant_macro_name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit SPIRConstant(uint32_t constant_type_)
	    : constant_type(constant_type_)
	{
	}